

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printSwitch(JSPrinter *this,Ref node)

{
  size_t sVar1;
  char cVar2;
  undefined8 *puVar3;
  long *plVar4;
  Ref *this_00;
  uint uVar5;
  ulong uVar6;
  Value *local_48;
  Ref node_local;
  Ref c;
  Ref cases;
  
  local_48 = node.inst;
  emit(this,"switch");
  space(this);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_48);
  print(this,(Value *)*puVar3);
  maybeSpace(this,')');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ')';
  space(this);
  maybeSpace(this,'{');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '{';
  newline(this);
  plVar4 = (long *)cashew::Ref::operator[]((uint)&local_48);
  c.inst = (Value *)*plVar4;
  if ((c.inst)->type == Array) {
    uVar6 = 0;
    do {
      if (((((c.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements <= uVar6) {
        emit(this,'}');
        return;
      }
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&c);
      node_local.inst = (Value *)*puVar3;
      uVar5 = (uint)&node_local;
      this_00 = (Ref *)cashew::Ref::operator[](uVar5);
      cVar2 = cashew::Ref::operator!(this_00);
      if (cVar2 == '\0') {
        emit(this,"case ");
        puVar3 = (undefined8 *)cashew::Ref::operator[](uVar5);
        print(this,(Value *)*puVar3);
        maybeSpace(this,':');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ':';
      }
      else {
        emit(this,"default:");
      }
      puVar3 = (undefined8 *)cashew::Ref::operator[](uVar5);
      if (*(int *)*puVar3 != 2) break;
      if (*(long *)(*(long *)((int *)*puVar3 + 2) + 8) == 0) {
LAB_00177a29:
        newline(this);
      }
      else {
        this->indent = this->indent + 1;
        newline(this);
        sVar1 = this->used;
        puVar3 = (undefined8 *)cashew::Ref::operator[](uVar5);
        printStats(this,(Value *)*puVar3);
        this->indent = this->indent + -1;
        if (sVar1 != this->used) goto LAB_00177a29;
        this->used = this->used - 1;
      }
      uVar6 = uVar6 + 1;
    } while ((c.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printSwitch(Ref node) {
    emit("switch");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    emit('{');
    newline();
    Ref cases = node[2];
    for (size_t i = 0; i < cases->size(); i++) {
      Ref c = cases[i];
      if (!c[0]) {
        emit("default:");
      } else {
        emit("case ");
        print(c[0]);
        emit(':');
      }
      if (c[1]->size() > 0) {
        indent++;
        newline();
        auto curr = used;
        printStats(c[1]);
        indent--;
        if (curr != used) {
          newline();
        } else {
          used--; // avoid the extra indentation we added tentatively
        }
      } else {
        newline();
      }
    }
    emit('}');
  }